

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  size_type unaff_R12;
  
  uVar3 = 0;
  do {
    if (have->_M_string_length <= uVar3) {
      return 0xffffffffffffffff;
    }
    sVar2 = std::__cxx11::string::find((char *)have,(ulong)(want->_M_dataplus)._M_p,uVar3);
    if ((sVar2 == 0xffffffffffffffff) ||
       (((sVar2 == 0 || ((have->_M_dataplus)._M_p[sVar2 - 1] == ':')) &&
        ((uVar4 = want->_M_string_length + sVar2, have->_M_string_length <= uVar4 ||
         ((have->_M_dataplus)._M_p[uVar4] == ':')))))) {
      bVar1 = false;
      unaff_R12 = sVar2;
    }
    else {
      uVar3 = sVar2 + 1;
      bVar1 = true;
    }
  } while (bVar1);
  return unaff_R12;
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}